

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O0

void glfwGetMonitorContentScale(GLFWmonitor *handle,float *xscale,float *yscale)

{
  float *in_RDX;
  float *in_RSI;
  _GLFWmonitor *in_RDI;
  _GLFWmonitor *monitor;
  
  if (in_RSI != (float *)0x0) {
    *in_RSI = 0.0;
  }
  if (in_RDX != (float *)0x0) {
    *in_RDX = 0.0;
  }
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
  }
  else {
    _glfwPlatformGetMonitorContentScale(in_RDI,in_RSI,in_RDX);
  }
  return;
}

Assistant:

GLFWAPI void glfwGetMonitorContentScale(GLFWmonitor* handle,
                                        float* xscale, float* yscale)
{
    _GLFWmonitor* monitor = (_GLFWmonitor*) handle;
    assert(monitor != NULL);

    if (xscale)
        *xscale = 0.f;
    if (yscale)
        *yscale = 0.f;

    _GLFW_REQUIRE_INIT();
    _glfwPlatformGetMonitorContentScale(monitor, xscale, yscale);
}